

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_acceptance.c
# Opt level: O3

REF_STATUS ref_acceptance_pd(REF_NODE ref_node,char *function_name,REF_INT *ldim,REF_DBL **scalar)

{
  int iVar1;
  REF_STATUS RVar2;
  uint uVar3;
  REF_DBL *pRVar4;
  undefined8 uVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  char *pcVar10;
  REF_DBL primitive [5];
  REF_DBL dual [5];
  REF_DBL local_88 [6];
  REF_DBL local_58 [5];
  
  *ldim = 10;
  uVar3 = ref_node->max;
  if ((int)uVar3 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_acceptance.c",
           0x1e5,"ref_acceptance_pd","malloc *scalar of REF_DBL negative");
    RVar2 = 1;
  }
  else {
    pRVar4 = (REF_DBL *)malloc((ulong)uVar3 * 0x50);
    *scalar = pRVar4;
    if (pRVar4 == (REF_DBL *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_acceptance.c",
             0x1e5,"ref_acceptance_pd","malloc *scalar of REF_DBL NULL");
      RVar2 = 2;
    }
    else {
      if ((ulong)uVar3 != 0) {
        lVar7 = 0;
        do {
          if (-1 < ref_node->global[lVar7]) {
            iVar1 = strcmp(function_name,"trig");
            iVar6 = (int)lVar7;
            if (iVar1 == 0) {
              ref_acceptance_primal_trig
                        (ref_node->real[lVar7 * 0xf],ref_node->real[lVar7 * 0xf + 1],local_88);
              uVar3 = ref_phys_entropy_adjoint(local_88,local_58);
              if (uVar3 != 0) {
                uVar5 = 0x1ee;
LAB_001110fc:
                pcVar10 = "entropy adj";
                uVar9 = (ulong)uVar3;
LAB_001110ff:
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_acceptance.c"
                       ,uVar5,"ref_acceptance_pd",uVar9,pcVar10);
                return uVar3;
              }
              pRVar4 = *scalar;
              iVar1 = *ldim;
              lVar8 = 0;
              do {
                pRVar4[iVar1 * iVar6 + lVar8] = local_88[lVar8];
                lVar8 = lVar8 + 1;
              } while (lVar8 != 5);
              lVar8 = 0;
              do {
                pRVar4[(long)(iVar1 * iVar6) + lVar8 + 5] = local_58[lVar8];
                lVar8 = lVar8 + 1;
              } while (lVar8 != 5);
            }
            else {
              iVar1 = strcmp(function_name,"vortex");
              if (iVar1 == 0) {
                ref_acceptance_primal_vortex
                          (ref_node->real[lVar7 * 0xf],ref_node->real[lVar7 * 0xf + 1],local_88);
                uVar3 = ref_phys_entropy_adjoint(local_88,local_58);
                if (uVar3 != 0) {
                  uVar5 = 0x1f7;
                  goto LAB_001110fc;
                }
                pRVar4 = *scalar;
                iVar1 = *ldim;
                lVar8 = 0;
                do {
                  pRVar4[iVar1 * iVar6 + lVar8] = local_88[lVar8];
                  lVar8 = lVar8 + 1;
                } while (lVar8 != 5);
                lVar8 = 0;
                do {
                  pRVar4[(long)(iVar1 * iVar6) + lVar8 + 5] = local_58[lVar8];
                  lVar8 = lVar8 + 1;
                } while (lVar8 != 5);
              }
              else {
                iVar1 = strcmp(function_name,"coax");
                if (iVar1 == 0) {
                  ref_acceptance_primal_coax
                            (ref_node->real[lVar7 * 0xf],ref_node->real[lVar7 * 0xf + 1],local_88);
                  uVar3 = ref_phys_entropy_adjoint(local_88,local_58);
                  if (uVar3 != 0) {
                    uVar5 = 0x200;
                    goto LAB_001110fc;
                  }
                  pRVar4 = *scalar;
                  iVar1 = *ldim;
                  lVar8 = 0;
                  do {
                    pRVar4[iVar1 * iVar6 + lVar8] = local_88[lVar8];
                    lVar8 = lVar8 + 1;
                  } while (lVar8 != 5);
                  lVar8 = 0;
                  do {
                    pRVar4[(long)(iVar1 * iVar6) + lVar8 + 5] = local_58[lVar8];
                    lVar8 = lVar8 + 1;
                  } while (lVar8 != 5);
                }
                else {
                  iVar1 = strcmp(function_name,"ringleb");
                  if (iVar1 != 0) {
                    printf("%s: %d: %s %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_acceptance.c"
                           ,0x20d,"unknown user function",function_name);
                    return 5;
                  }
                  RVar2 = ref_acceptance_primal_ringleb
                                    (ref_node->real[lVar7 * 0xf],ref_node->real[lVar7 * 0xf + 1],
                                     local_88);
                  if (RVar2 != 0) {
                    pcVar10 = "ringleb";
                    uVar3 = 1;
                    uVar5 = 0x208;
                    uVar9 = 1;
                    goto LAB_001110ff;
                  }
                  uVar3 = ref_phys_entropy_adjoint(local_88,local_58);
                  if (uVar3 != 0) {
                    uVar5 = 0x209;
                    goto LAB_001110fc;
                  }
                  pRVar4 = *scalar;
                  iVar1 = *ldim;
                  lVar8 = 0;
                  do {
                    pRVar4[iVar1 * iVar6 + lVar8] = local_88[lVar8];
                    lVar8 = lVar8 + 1;
                  } while (lVar8 != 5);
                  lVar8 = 0;
                  do {
                    pRVar4[(long)(iVar1 * iVar6) + lVar8 + 5] = local_58[lVar8];
                    lVar8 = lVar8 + 1;
                  } while (lVar8 != 5);
                }
              }
            }
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 < ref_node->max);
      }
      RVar2 = 0;
    }
  }
  return RVar2;
}

Assistant:

REF_FCN static REF_STATUS ref_acceptance_pd(REF_NODE ref_node,
                                            const char *function_name,
                                            REF_INT *ldim, REF_DBL **scalar) {
  REF_INT node, i;
  *ldim = 10;
  ref_malloc(*scalar, (*ldim) * ref_node_max(ref_node), REF_DBL);

  each_ref_node_valid_node(ref_node, node) {
    if (strcmp(function_name, "trig") == 0) {
      REF_DBL primitive[5], dual[5];
      RSS(ref_acceptance_primal_trig(ref_node_xyz(ref_node, 0, node),
                                     ref_node_xyz(ref_node, 1, node),
                                     primitive),
          "trig");
      RSS(ref_phys_entropy_adjoint(primitive, dual), "entropy adj");
      for (i = 0; i < 5; i++) (*scalar)[i + (*ldim) * node] = primitive[i];
      for (i = 0; i < 5; i++) (*scalar)[i + 5 + (*ldim) * node] = dual[i];
    } else if (strcmp(function_name, "vortex") == 0) {
      REF_DBL primitive[5], dual[5];
      RSS(ref_acceptance_primal_vortex(ref_node_xyz(ref_node, 0, node),
                                       ref_node_xyz(ref_node, 1, node),
                                       primitive),
          "vortex");
      RSS(ref_phys_entropy_adjoint(primitive, dual), "entropy adj");
      for (i = 0; i < 5; i++) (*scalar)[i + (*ldim) * node] = primitive[i];
      for (i = 0; i < 5; i++) (*scalar)[i + 5 + (*ldim) * node] = dual[i];
    } else if (strcmp(function_name, "coax") == 0) {
      REF_DBL primitive[5], dual[5];
      RSS(ref_acceptance_primal_coax(ref_node_xyz(ref_node, 0, node),
                                     ref_node_xyz(ref_node, 1, node),
                                     primitive),
          "coax");
      RSS(ref_phys_entropy_adjoint(primitive, dual), "entropy adj");
      for (i = 0; i < 5; i++) (*scalar)[i + (*ldim) * node] = primitive[i];
      for (i = 0; i < 5; i++) (*scalar)[i + 5 + (*ldim) * node] = dual[i];
    } else if (strcmp(function_name, "ringleb") == 0) {
      REF_DBL primitive[5], dual[5];
      RSS(ref_acceptance_primal_ringleb(ref_node_xyz(ref_node, 0, node),
                                        ref_node_xyz(ref_node, 1, node),
                                        primitive),
          "ringleb");
      RSS(ref_phys_entropy_adjoint(primitive, dual), "entropy adj");
      for (i = 0; i < 5; i++) (*scalar)[i + (*ldim) * node] = primitive[i];
      for (i = 0; i < 5; i++) (*scalar)[i + 5 + (*ldim) * node] = dual[i];
    } else {
      printf("%s: %d: %s %s\n", __FILE__, __LINE__, "unknown user function",
             function_name);
      return REF_NOT_FOUND;
    }
  }
  return REF_SUCCESS;
}